

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateSerializeOneField
          (ImmutableMessageGenerator *this,Printer *printer,FieldDescriptor *field)

{
  ImmutableFieldGenerator *pIVar1;
  
  pIVar1 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                     (&this->field_generators_,field);
  (*pIVar1->_vptr_ImmutableFieldGenerator[0xe])(pIVar1,printer);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateSerializeOneField(
    io::Printer* printer, const FieldDescriptor* field) {
  field_generators_.get(field).GenerateSerializationCode(printer);
}